

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O1

bool __thiscall
BackwardPass::IsImplicitCallBailOutCurrentlyNeeded
          (BackwardPass *this,Instr *instr,bool mayNeedImplicitCallBailOut,bool needLazyBailOut,
          bool hasLiveFields)

{
  bool bVar1;
  GlobOpt *this_00;
  
  this_00 = this->globOpt;
  bVar1 = GlobOpt::IsImplicitCallBailOutCurrentlyNeeded
                    (this_00,instr,(Value *)0x0,(Value *)0x0,this->currentBlock,hasLiveFields,
                     mayNeedImplicitCallBailOut,false,needLazyBailOut);
  if (bVar1) {
    return true;
  }
  bVar1 = NeedBailOutOnImplicitCallsForTypedArrayStore((BackwardPass *)this_00,instr);
  return bVar1;
}

Assistant:

bool
BackwardPass::IsImplicitCallBailOutCurrentlyNeeded(IR::Instr * instr, bool mayNeedImplicitCallBailOut, bool needLazyBailOut, bool hasLiveFields)
{
    return this->globOpt->IsImplicitCallBailOutCurrentlyNeeded(
        instr, nullptr /* src1Val */, nullptr /* src2Val */,
        this->currentBlock, hasLiveFields, mayNeedImplicitCallBailOut, false /* isForwardPass */, needLazyBailOut
    ) ||
    this->NeedBailOutOnImplicitCallsForTypedArrayStore(instr);
}